

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

int __thiscall ncnn::Scale::load_model(Scale *this,ModelBin *mb)

{
  bool bVar1;
  undefined8 *in_RSI;
  long in_RDI;
  Mat *in_stack_ffffffffffffff50;
  Mat *m;
  Mat *in_stack_ffffffffffffff58;
  Mat local_98;
  Mat local_50;
  undefined8 *local_18;
  
  local_18 = in_RSI;
  if (*(int *)(in_RDI + 0x80) != -0xe9) {
    in_stack_ffffffffffffff58 = &local_50;
    (**(code **)*in_RSI)(in_stack_ffffffffffffff58,in_RSI,*(undefined4 *)(in_RDI + 0x80),1);
    Mat::operator=(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    Mat::~Mat((Mat *)0x12f0e0);
    bVar1 = Mat::empty(in_stack_ffffffffffffff50);
    if (bVar1) {
      return -100;
    }
  }
  if (*(int *)(in_RDI + 0x84) != 0) {
    m = &local_98;
    (**(code **)*local_18)(m,local_18,*(undefined4 *)(in_RDI + 0x80),1);
    Mat::operator=(in_stack_ffffffffffffff58,m);
    Mat::~Mat((Mat *)0x12f184);
    bVar1 = Mat::empty(m);
    if (bVar1) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Scale::load_model(const ModelBin& mb)
{
    if (scale_data_size != -233)
    {
        scale_data = mb.load(scale_data_size, 1);
        if (scale_data.empty())
            return -100;
    }

    if (bias_term)
    {
        bias_data = mb.load(scale_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}